

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O0

mat4_t * mat4_lookat(mat4_t *__return_storage_ptr__,vec3_t eye,vec3_t dest,vec3_t up)

{
  mat4_t a;
  mat4_t b;
  vec3_t vVar1;
  vec3_t vVar2;
  vec3_t vVar3;
  mat4_t *pmVar4;
  undefined1 auStack_278 [8];
  mat4_t m;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined1 auStack_1f8 [8];
  mat4_t trans;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  undefined8 local_178;
  float local_170;
  undefined8 local_168;
  float local_160;
  undefined8 local_158;
  vec3_t u;
  float local_e8;
  float fStack_e4;
  vec3_t s;
  float local_78;
  float fStack_74;
  vec3_t f;
  vec3_t up_local;
  vec3_t dest_local;
  vec3_t eye_local;
  
  pmVar4 = __return_storage_ptr__;
  vVar1 = vec3_sub(dest,eye);
  vVar1 = vec3_normalize(vVar1);
  vVar2 = vec3_cross(vVar1,up);
  vVar2 = vec3_normalize(vVar2);
  local_178 = vVar2._0_8_;
  local_188 = vVar1._0_8_;
  local_180 = vVar1.z;
  local_170 = vVar2.z;
  unique0x10000a20 = local_178;
  vVar3 = vec3_cross(vVar2,vVar1);
  local_1a0 = vVar3.z;
  local_1a8 = vVar3._0_8_;
  local_198 = local_1a8;
  local_190 = local_1a0;
  local_168 = local_1a8;
  local_160 = local_1a0;
  vVar3 = vec3_normalize(vVar3);
  local_1b0 = vVar3.z;
  trans._56_8_ = vVar3._0_8_;
  local_218 = eye._0_8_;
  local_210 = eye.z;
  local_158 = trans._56_8_;
  u.x = local_1b0;
  vVar3 = vec3_neg(eye);
  local_230 = vVar3.z;
  m._56_8_ = vVar3._0_8_;
  local_228 = m._56_8_;
  local_220 = local_230;
  local_208 = m._56_8_;
  local_200 = local_230;
  mat4_translation((mat4_t *)auStack_1f8,vVar3);
  local_e8 = vVar2.x;
  local_78 = vVar1.x;
  fStack_e4 = vVar2.y;
  fStack_74 = vVar1.y;
  mat4((mat4_t *)auStack_278,local_e8,(float)local_158,-local_78,0.0,fStack_e4,local_158._4_4_,
       -fStack_74,0.0,vVar2.z,u.x,-vVar1.z,0.0,0.0,0.0,0.0,1.0);
  a.m[0][2] = (float)(int)m._8_8_;
  a._0_8_ = m._0_8_;
  a.m[0][3] = (float)(int)((ulong)m._8_8_ >> 0x20);
  a.m[1][0] = (float)(int)m._16_8_;
  a.m[1][1] = (float)(int)((ulong)m._16_8_ >> 0x20);
  a.m[1][2] = (float)(int)m._24_8_;
  a.m[1][3] = (float)(int)((ulong)m._24_8_ >> 0x20);
  a.m[2][0] = (float)(int)m._32_8_;
  a.m[2][1] = (float)(int)((ulong)m._32_8_ >> 0x20);
  a.m[2][2] = (float)(int)m._40_8_;
  a.m[2][3] = (float)(int)((ulong)m._40_8_ >> 0x20);
  a.m[3][0] = (float)(int)m._48_8_;
  a.m[3][1] = (float)(int)((ulong)m._48_8_ >> 0x20);
  a._56_8_ = auStack_1f8;
  b._8_8_ = trans._8_8_;
  b._0_8_ = trans._0_8_;
  b._16_8_ = trans._16_8_;
  b._24_8_ = trans._24_8_;
  b._32_8_ = trans._32_8_;
  b._40_8_ = trans._40_8_;
  b._48_8_ = trans._48_8_;
  b._56_8_ = pmVar4;
  mat4_mulm(a,b);
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_lookat(vec3_t eye, vec3_t dest, vec3_t up) {
    vec3_t	f	= vec3_normalize(vec3_sub(dest, eye));
    vec3_t	s	= vec3_normalize(vec3_cross(f, up));
    vec3_t	u	= vec3_normalize(vec3_cross(s, f));

    mat4_t	trans	= mat4_translation(vec3_neg(eye));

    mat4_t	m	= mat4(s.x, u.x, -f.x, 0.0f,
                   s.y, u.y, -f.y, 0.0f,
                   s.z, u.z, -f.z, 0.0f,
                   0.0f, 0.0f, 0.0f, 1.0f);
    return mat4_mulm(m, trans);
}